

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint ON_MeshNgon::IsValid
               (ON_MeshNgon *ngon,uint ngon_index,ON_TextLog *text_logx,uint mesh_vertex_count,
               uint mesh_face_count,ON_MeshFace *mesh_F,
               ON_SimpleArray<unsigned_int> *workspace_buffer)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  ON_TextLog *this;
  ON_MeshFace *pOVar4;
  uint *a;
  uint *puVar5;
  bool bSilentError_00;
  uint local_c4;
  uint uStack_c0;
  uint nvi_2;
  ON_2udex e0;
  uint i;
  uint bdry_edge_count;
  uint *fvi1;
  uint vi1;
  uint vi0;
  uint *fvi_1;
  uint local_90;
  uint fi_2;
  uint nfi_1;
  uint edge_count;
  ON_2udex *edges;
  uint *workspace;
  uint nvi_1;
  uint *fvi;
  uint fi_1;
  uint fi;
  uint nfi;
  uint nvi;
  ON_TextLog *text_log;
  bool bSilentError;
  ON__INT_PTR hightbits;
  ON__INT_PTR lowbit;
  ON_MeshFace *mesh_F_local;
  uint mesh_face_count_local;
  uint mesh_vertex_count_local;
  ON_TextLog *text_logx_local;
  uint ngon_index_local;
  ON_MeshNgon *ngon_local;
  
  ON_SimpleArray<unsigned_int>::SetCount(workspace_buffer,0);
  if (ngon == (ON_MeshNgon *)0x0) {
    ngon_local._4_4_ = 1;
  }
  else {
    bSilentError_00 = ((ulong)text_logx & 1) != 0;
    this = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
    if (ngon->m_Vcount < 3) {
      if (this != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_Vcount < 3.\n",(ulong)ngon_index);
      }
      ngon_local._4_4_ = ON_MeshNgonIsNotValid(bSilentError_00);
    }
    else if (ngon->m_Fcount == 0) {
      if (this != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_Fcount < 1.\n",(ulong)ngon_index);
      }
      ngon_local._4_4_ = ON_MeshNgonIsNotValid(bSilentError_00);
    }
    else if (ngon->m_vi == (uint *)0x0) {
      if (this != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_vi is nullptr.\n",(ulong)ngon_index);
      }
      ngon_local._4_4_ = ON_MeshNgonIsNotValid(bSilentError_00);
    }
    else if (ngon->m_fi == (uint *)0x0) {
      if (this != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_fi is nullptr.\n",(ulong)ngon_index);
      }
      ngon_local._4_4_ = ON_MeshNgonIsNotValid(bSilentError_00);
    }
    else {
      for (fi = 0; fi < ngon->m_Vcount; fi = fi + 1) {
        if (mesh_vertex_count <= ngon->m_vi[fi]) {
          if (this != (ON_TextLog *)0x0) {
            ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n",(ulong)ngon_index,
                              (ulong)fi);
          }
          uVar3 = ON_MeshNgonIsNotValid(bSilentError_00);
          return uVar3;
        }
      }
      for (fi_1 = 0; fi_1 < ngon->m_Fcount; fi_1 = fi_1 + 1) {
        if (mesh_face_count <= ngon->m_fi[fi_1]) {
          if (this != (ON_TextLog *)0x0) {
            ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n",(ulong)ngon_index,
                              (ulong)fi_1);
          }
          uVar3 = ON_MeshNgonIsNotValid(bSilentError_00);
          return uVar3;
        }
      }
      if (mesh_F == (ON_MeshFace *)0x0) {
        ngon_local._4_4_ = 1;
      }
      else {
        if (((ngon->m_Fcount == 1) && (2 < ngon->m_Vcount)) && (ngon->m_Vcount < 5)) {
          uVar3 = *ngon->m_fi;
          bVar2 = ON_MeshFace::IsValid(mesh_F + uVar3,mesh_vertex_count);
          if (!bVar2) {
            if (this != (ON_TextLog *)0x0) {
              ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n",(ulong)ngon_index);
            }
            uVar3 = ON_MeshNgonIsNotValid(bSilentError_00);
            return uVar3;
          }
          pOVar4 = mesh_F + uVar3;
          for (workspace._4_4_ = 0; workspace._4_4_ < ngon->m_Vcount;
              workspace._4_4_ = workspace._4_4_ + 1) {
            if (((pOVar4->vi[0] == ngon->m_vi[workspace._4_4_]) &&
                (pOVar4->vi[1] == ngon->m_vi[(ulong)(workspace._4_4_ + 1) % (ulong)ngon->m_Vcount]))
               && (pOVar4->vi[2] == ngon->m_vi[(ulong)(workspace._4_4_ + 2) % (ulong)ngon->m_Vcount]
                  )) {
              if ((ngon->m_Vcount == 3) && (pOVar4->vi[3] == pOVar4->vi[2])) {
                return 3;
              }
              if ((ngon->m_Vcount == 4) &&
                 (pOVar4->vi[3] == ngon->m_vi[(ulong)(workspace._4_4_ + 3) % (ulong)ngon->m_Vcount])
                 ) {
                return 4;
              }
            }
          }
        }
        a = ON_SimpleArray<unsigned_int>::Reserve(workspace_buffer,(ulong)(ngon->m_Fcount << 3));
        fi_2 = 0;
        for (local_90 = 0; local_90 < ngon->m_Fcount; local_90 = local_90 + 1) {
          _vi1 = mesh_F[ngon->m_fi[local_90]].vi;
          pOVar4 = (ON_MeshFace *)(_vi1 + 4);
          fvi1._0_4_ = _vi1[3];
          for (; _vi1 < pOVar4; _vi1 = _vi1 + 1) {
            uVar3 = *_vi1;
            if ((uint)fvi1 < uVar3) {
              a[(ulong)fi_2 * 2] = (uint)fvi1;
              a[(ulong)fi_2 * 2 + 1] = uVar3;
              fi_2 = fi_2 + 1;
            }
            else if (uVar3 < (uint)fvi1) {
              a[(ulong)fi_2 * 2] = uVar3;
              a[(ulong)fi_2 * 2 + 1] = (uint)fvi1;
              fi_2 = fi_2 + 1;
            }
            fvi1._0_4_ = uVar3;
          }
        }
        if (fi_2 < ngon->m_Vcount) {
          if (this != (ON_TextLog *)0x0) {
            ON_TextLog::Print(this,"ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",
                              (ulong)ngon_index);
          }
          ngon_local._4_4_ = ON_MeshNgonIsNotValid(bSilentError_00);
        }
        else {
          ON_qsort(a,(ulong)fi_2,8,compare2u);
          e0.j = 0;
          e0.i = 0;
          while (e0.i < fi_2) {
            uVar3 = e0.i + 1;
            uVar1 = *(undefined8 *)(a + (ulong)e0.i * 2);
            if (((uVar3 < fi_2) && (uStack_c0 = (uint)uVar1, uStack_c0 == a[(ulong)uVar3 * 2])) &&
               (nvi_2 = (uint)((ulong)uVar1 >> 0x20), nvi_2 == a[(ulong)uVar3 * 2 + 1])) {
              e0.i = e0.i + 2;
              while (((e0.i < fi_2 && (uStack_c0 == a[(ulong)e0.i * 2])) &&
                     (nvi_2 == a[(ulong)e0.i * 2 + 1]))) {
                e0.i = e0.i + 1;
              }
            }
            else {
              *(undefined8 *)(a + (ulong)e0.j * 2) = uVar1;
              e0.i = uVar3;
              e0.j = e0.j + 1;
            }
          }
          if (e0.j < ngon->m_Vcount) {
            if (this != (ON_TextLog *)0x0) {
              ON_TextLog::Print(this,"ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",
                                (ulong)ngon_index);
            }
            ngon_local._4_4_ = ON_MeshNgonIsNotValid(bSilentError_00);
          }
          else {
            ON_SortUnsignedIntArray(quick_sort,a,(ulong)(e0.j << 1));
            for (local_c4 = 0; local_c4 < ngon->m_Vcount; local_c4 = local_c4 + 1) {
              puVar5 = ON_BinarySearchUnsignedIntArray(ngon->m_vi[local_c4],a,(ulong)(e0.j << 1));
              if (puVar5 == (uint *)0x0) {
                if (this != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(this,"ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n",
                                    (ulong)ngon_index,(ulong)local_c4);
                }
                uVar3 = ON_MeshNgonIsNotValid(bSilentError_00);
                return uVar3;
              }
            }
            ngon_local._4_4_ = e0.j;
          }
        }
      }
    }
  }
  return ngon_local._4_4_;
}

Assistant:

unsigned int ON_MeshNgon::IsValid(
  const ON_MeshNgon* ngon,
  unsigned int ngon_index,
  ON_TextLog* text_logx,
  unsigned int mesh_vertex_count,
  unsigned int mesh_face_count,
  const ON_MeshFace* mesh_F,
  ON_SimpleArray< unsigned int >& workspace_buffer
  )
{
  workspace_buffer.SetCount(0);
  if ( nullptr == ngon )
    return true; // null ngons are ok

  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  if (ngon->m_Vcount < 3)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Vcount < 3.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if (ngon->m_Fcount < 1)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Fcount < 1.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_vi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_vi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_fi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_fi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if (ngon->m_vi[nvi] >= mesh_vertex_count)
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];
    if (fi >= mesh_face_count)
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n", ngon_index, nfi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  if (nullptr == mesh_F)
  {
    // mesh faces are required to check the boundary
    return true;
  }

  if (1 == ngon->m_Fcount && ngon->m_Vcount >= 3 && ngon->m_Vcount <= 4)
  {
    // fast test for a valid single face ngon
    unsigned int fi = ngon->m_fi[0];
    if (false == mesh_F[fi].IsValid(mesh_vertex_count))
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n", ngon_index);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
    const unsigned int* fvi = (const unsigned int*)mesh_F[fi].vi;
    for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
    {
      if (fvi[0] == ngon->m_vi[nvi] && fvi[1] == ngon->m_vi[(nvi+1)%ngon->m_Vcount] && fvi[2] == ngon->m_vi[(nvi+2)%ngon->m_Vcount])
      {
        if (3 == ngon->m_Vcount && fvi[3] == fvi[2])
          return 3;
        if (4 == ngon->m_Vcount && fvi[3] == ngon->m_vi[(nvi+3)%ngon->m_Vcount])
          return 4;
      }
    }
    // boundary may be reversed
  }

  unsigned int* workspace = workspace_buffer.Reserve(8*ngon->m_Fcount);
  ON_2udex* edges = (ON_2udex*)workspace;
  unsigned int edge_count = 0;
  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];

    const unsigned int* fvi = (const unsigned int*)(mesh_F[fi].vi);
    unsigned int vi0;
    unsigned int vi1 = fvi[3];
    for (const unsigned int* fvi1 = fvi + 4; fvi < fvi1; fvi++)
    {
      vi0 = vi1;
      vi1 = *fvi;
      if (vi0 < vi1)
      {
        edges[edge_count].i = vi0;
        edges[edge_count++].j = vi1;
      }
      else if (vi0 > vi1)
      {
        edges[edge_count].i = vi1;
        edges[edge_count++].j = vi0;
      }
    }
  }

  if (edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]),compare2u);

  unsigned int bdry_edge_count = 0;
  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    const ON_2udex e0 = edges[i++];
    if (i < edge_count && e0.i == edges[i].i && e0.j == edges[i].j)
    {
      // not a boundary edge
      for (i++; i < edge_count; i++)
      {
        if (e0.i != edges[i].i || e0.j != edges[i].j)
          break;
      }
    }
    else
    {
      edges[bdry_edge_count++] = e0;
    }
  }

  if (bdry_edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_SortUnsignedIntArray( ON::sort_algorithm::quick_sort, workspace, 2*bdry_edge_count );

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if ( nullptr == ON_BinarySearchUnsignedIntArray( ngon->m_vi[nvi], workspace, 2*bdry_edge_count) )
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  // It is possible that the ngon is still not valid.
  //
  // If bdry_edge_count > ngon->m_Vcount, then there "could" be one or
  // more inner "holes" and the ngon->m_vi[] could reference a vertex
  // on an inner boundary.
  //
  // The vertices in ngon->m_v[] may not be a proper outer boundary.
  //
  // ...


  return bdry_edge_count;
}